

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalUpdateExtensions,duckdb::unique_ptr<duckdb::UpdateExtensionsInfo,std::default_delete<duckdb::UpdateExtensionsInfo>,true>,unsigned_long&>
          (PhysicalPlan *this,
          unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
          *args,unsigned_long *args_1)

{
  pointer *pprVar1;
  iterator __position;
  PhysicalUpdateExtensions *this_00;
  _Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false> local_30;
  reference_wrapper<duckdb::PhysicalOperator> local_28;
  
  this_00 = (PhysicalUpdateExtensions *)ArenaAllocator::AllocateAligned(&this->arena,0x88);
  local_30._M_head_impl =
       (args->
       super_unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl;
  (args->
  super_unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl =
       (UpdateExtensionsInfo *)0x0;
  PhysicalUpdateExtensions::PhysicalUpdateExtensions
            (this_00,(unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                      *)&local_30,*args_1);
  if (local_30._M_head_impl != (UpdateExtensionsInfo *)0x0) {
    (*((local_30._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_30._M_head_impl = (UpdateExtensionsInfo *)0x0;
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_28._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_28);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}